

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_client.cpp
# Opt level: O3

int __thiscall CNetClient::Update(CNetClient *this)

{
  CNetConnection *this_00;
  char *pReason;
  
  this_00 = &this->m_Connection;
  CNetConnection::Update(this_00);
  if ((this->m_Connection).m_State == 5) {
    pReason = CNetConnection::ErrorString(this_00);
    CNetConnection::Disconnect(this_00,pReason);
  }
  CNetTokenManager::Update(&this->m_TokenManager);
  CNetTokenCache::Update(&this->m_TokenCache);
  return 0;
}

Assistant:

int CNetClient::Update()
{
	m_Connection.Update();
	if(m_Connection.State() == NET_CONNSTATE_ERROR)
		Disconnect(m_Connection.ErrorString());
	m_TokenManager.Update();
	m_TokenCache.Update();
	return 0;
}